

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pCVar2;
  ostream *poVar3;
  int in_EAX;
  int extraout_EAX;
  pointer text;
  long lVar4;
  Columns headerCols;
  Columns local_88;
  Column local_70;
  
  if (this->m_isOpen == false) {
    this->m_isOpen = true;
    if (0 < this->m_currentColumn) {
      local_70.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(this->m_os,(char *)&local_70,1);
      this->m_currentColumn = -1;
    }
    local_88.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    text = (this->m_columnInfos).
           super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
    pCVar2 = (this->m_columnInfos).
             super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (text != pCVar2) {
      paVar1 = &local_70.m_string.m_string.field_2;
      do {
        TextFlow::Column::Column(&local_70,&text->name);
        local_70.m_width = text->width - 2;
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::
        emplace_back<Catch::TextFlow::Column>(&local_88.m_columns,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_70.m_string.m_string._M_dataplus._M_p._1_7_,
                        local_70.m_string.m_string._M_dataplus._M_p._0_1_) != paVar1) {
          operator_delete((undefined1 *)
                          CONCAT71(local_70.m_string.m_string._M_dataplus._M_p._1_7_,
                                   local_70.m_string.m_string._M_dataplus._M_p._0_1_),
                          local_70.m_string.m_string.field_2._M_allocated_capacity + 1);
        }
        TextFlow::Spacer(&local_70,2);
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::
        emplace_back<Catch::TextFlow::Column>(&local_88.m_columns,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_70.m_string.m_string._M_dataplus._M_p._1_7_,
                        local_70.m_string.m_string._M_dataplus._M_p._0_1_) != paVar1) {
          operator_delete((undefined1 *)
                          CONCAT71(local_70.m_string.m_string._M_dataplus._M_p._1_7_,
                                   local_70.m_string.m_string._M_dataplus._M_p._0_1_),
                          local_70.m_string.m_string.field_2._M_allocated_capacity + 1);
        }
        text = text + 1;
      } while (text != pCVar2);
    }
    poVar3 = this->m_os;
    TextFlow::operator<<(poVar3,&local_88);
    local_70.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_70,1);
    poVar3 = this->m_os;
    lVar4 = 0x4f;
    do {
      std::ostream::put((char)poVar3);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    local_70.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_70,1);
    std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
              (&local_88.m_columns);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			TextFlow::Columns headerCols;
			for (auto const& info : m_columnInfos) {
                assert(info.width > 2);
				headerCols += TextFlow::Column(info.name).width(info.width - 2);
                headerCols += TextFlow::Spacer( 2 );
			}
			m_os << headerCols << '\n';

            m_os << lineOfChars('-') << '\n';
        }
    }